

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_manager.cpp
# Opt level: O3

void __thiscall
ot::commissioner::TokenManager::RequestToken
          (TokenManager *this,Handler<ByteArray> *aHandler,string *aAddr,uint16_t aPort)

{
  undefined8 *puVar1;
  anon_class_40_2_1bbb15e4 onConnected;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  TokenManager *local_50;
  _Any_data local_48;
  code *local_38;
  
  local_50 = this;
  std::
  function<void_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_ot::commissioner::Error)>
  ::function((function<void_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_ot::commissioner::Error)>
              *)&local_48,aHandler);
  local_68 = (code *)0x0;
  pcStack_60 = (code *)0x0;
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  puVar1 = (undefined8 *)operator_new(0x28);
  *puVar1 = local_50;
  std::
  function<void_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_ot::commissioner::Error)>
  ::function((function<void_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_ot::commissioner::Error)>
              *)(puVar1 + 1),
             (function<void_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_*,_ot::commissioner::Error)>
              *)&local_48);
  pcStack_60 = std::
               _Function_handler<void_(ot::commissioner::DtlsSession_&,_ot::commissioner::Error),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/token_manager.cpp:168:24)>
               ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(ot::commissioner::DtlsSession_&,_ot::commissioner::Error),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/token_manager.cpp:168:24)>
             ::_M_manager;
  local_78._M_unused._M_object = puVar1;
  coap::CoapSecure::Connect(&this->mRegistrarClient,(ConnectHandler *)&local_78,aAddr,aPort);
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  return;
}

Assistant:

void TokenManager::RequestToken(Commissioner::Handler<ByteArray> aHandler, const std::string &aAddr, uint16_t aPort)
{
    auto onConnected = [this, aHandler](const DtlsSession &, Error aError) {
        if (aError != ErrorCode::kNone)
        {
            aHandler(nullptr, aError);
        }
        else
        {
            SendTokenRequest(aHandler);
        }
    };

    mRegistrarClient.Connect(onConnected, aAddr, aPort);
}